

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O0

void fmt::v11::detail::
     parse_format_string<char,fmt::v11::detail::format_string_checker<char,2,0,false>>
               (basic_string_view<char> fmt,format_string_checker<char,_2,_0,_false> *handler)

{
  int iVar1;
  id_adapter *piVar2;
  size_t sVar3;
  format_string_checker<char,_2,_0,_false> *in_RDX;
  char c;
  char *p;
  char *end;
  char *begin;
  char c_1;
  id_adapter adapter;
  int arg_id;
  undefined4 in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff6c;
  format_string_checker<char,_2,_0,_false> *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff88;
  char cVar4;
  id_adapter *local_70;
  id_adapter *handler_00;
  id_adapter *piVar5;
  id_adapter *end_00;
  format_string_checker<char,_2,_0,_false> *pfVar6;
  basic_string_view<char> local_50;
  char local_39;
  int local_30;
  int local_24;
  id_adapter *local_18;
  id_adapter *local_10;
  id_adapter *local_8;
  
  piVar2 = (id_adapter *)basic_string_view<char>::data(&local_50);
  piVar5 = piVar2;
  sVar3 = basic_string_view<char>::size(&local_50);
  handler_00 = (id_adapter *)((long)&piVar2->handler + sVar3);
  end_00 = piVar5;
  do {
    while( true ) {
      local_70 = piVar5;
      if (local_70 == handler_00) {
        format_string_checker<char,_2,_0,_false>::on_text(in_RDX,(char *)end_00,(char *)handler_00);
        return;
      }
      piVar5 = (id_adapter *)((long)&local_70->handler + 1);
      cVar4 = *(char *)&local_70->handler;
      if (cVar4 == '{') break;
      if (cVar4 == '}') {
        if ((piVar5 == handler_00) || (*(char *)&piVar5->handler != '}')) {
          format_string_checker<char,_2,_0,_false>::on_error
                    (in_stack_ffffffffffffff70,
                     (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        }
        format_string_checker<char,_2,_0,_false>::on_text(in_RDX,(char *)end_00,(char *)piVar5);
        end_00 = (id_adapter *)((long)&local_70->handler + 2);
        piVar5 = end_00;
      }
    }
    format_string_checker<char,_2,_0,_false>::on_text(in_RDX,(char *)end_00,(char *)local_70);
    local_10 = (id_adapter *)((long)&local_70->handler + 1);
    local_18 = handler_00;
    if (local_10 == handler_00) {
      format_string_checker<char,_2,_0,_false>::on_error
                (in_stack_ffffffffffffff70,
                 (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
    local_24 = 0;
    iVar1 = (int)*(char *)&local_10->handler;
    if (iVar1 == 0x3a) {
      local_24 = format_string_checker<char,_2,_0,_false>::on_arg_id
                           ((format_string_checker<char,_2,_0,_false> *)0x382efd);
LAB_00382fca:
      local_10 = (id_adapter *)
                 format_string_checker<char,_2,_0,_false>::on_format_specs
                           ((format_string_checker<char,_2,_0,_false> *)
                            CONCAT17(cVar4,in_stack_ffffffffffffff88),(int)((ulong)piVar2 >> 0x20),
                            (char *)CONCAT44(iVar1,in_stack_ffffffffffffff78),
                            (char *)in_stack_ffffffffffffff70);
      if ((local_10 == local_18) || (*(char *)&local_10->handler != '}')) {
        format_string_checker<char,_2,_0,_false>::on_error
                  (in_stack_ffffffffffffff70,
                   (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      }
      local_8 = (id_adapter *)((long)&local_10->handler + 1);
    }
    else if (iVar1 == 0x7b) {
      format_string_checker<char,_2,_0,_false>::on_text
                (in_RDX,(char *)local_10,(char *)((long)&local_70->handler + 2));
      local_8 = (id_adapter *)((long)&local_10->handler + 1);
    }
    else if (iVar1 == 0x7d) {
      pfVar6 = in_RDX;
      format_string_checker<char,_2,_0,_false>::on_arg_id
                ((format_string_checker<char,_2,_0,_false> *)0x382e8f);
      format_string_checker<char,_2,_0,_false>::on_replacement_field
                (in_RDX,in_stack_ffffffffffffff6c,(char *)0x382ea3);
      local_8 = (id_adapter *)((long)&local_10->handler + 1);
      in_stack_ffffffffffffff70 = in_RDX;
      in_RDX = pfVar6;
    }
    else {
      local_30 = 0;
      local_10 = (id_adapter *)
                 parse_arg_id<char,fmt::v11::detail::parse_replacement_field<char,fmt::v11::detail::format_string_checker<char,2,0,false>&>(char_const*,char_const*,fmt::v11::detail::format_string_checker<char,2,0,false>&)::id_adapter&>
                           ((char *)in_RDX,(char *)end_00,handler_00);
      local_24 = local_30;
      if (local_10 == local_18) {
        in_stack_ffffffffffffff6c = in_stack_ffffffffffffff6c & 0xffffff;
      }
      else {
        in_stack_ffffffffffffff6c =
             CONCAT13(*(char *)&local_10->handler,(int3)in_stack_ffffffffffffff6c);
      }
      local_39 = (char)(in_stack_ffffffffffffff6c >> 0x18);
      if (local_39 != '}') {
        if (local_39 != ':') {
          format_string_checker<char,_2,_0,_false>::on_error
                    (in_stack_ffffffffffffff70,
                     (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        }
        goto LAB_00382fca;
      }
      format_string_checker<char,_2,_0,_false>::on_replacement_field
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,(char *)0x382f94);
      local_8 = (id_adapter *)((long)&local_10->handler + 1);
    }
    local_70 = local_8;
    piVar5 = local_70;
    end_00 = local_8;
  } while( true );
}

Assistant:

FMT_CONSTEXPR void parse_format_string(basic_string_view<Char> fmt,
                                       Handler&& handler) {
  auto begin = fmt.data(), end = begin + fmt.size();
  auto p = begin;
  while (p != end) {
    auto c = *p++;
    if (c == '{') {
      handler.on_text(begin, p - 1);
      begin = p = parse_replacement_field(p - 1, end, handler);
    } else if (c == '}') {
      if (p == end || *p != '}')
        return handler.on_error("unmatched '}' in format string");
      handler.on_text(begin, p);
      begin = ++p;
    }
  }
  handler.on_text(begin, end);
}